

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::App::operator[](App *this,char *option_name)

{
  Option *pOVar1;
  allocator<char> local_31;
  string local_30;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,option_name,&local_31);
  pOVar1 = get_option(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return pOVar1;
}

Assistant:

const Option *operator[](const char *option_name) const { return get_option(option_name); }